

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Minefield_Data_PDU::Encode(Minefield_Data_PDU *this,KDataStream *stream)

{
  KUINT16 PDUL;
  byte bVar1;
  KBOOL KVar2;
  byte bVar3;
  bool bVar4;
  KUINT8 T;
  KUINT16 T_00;
  KDataStream *pKVar5;
  reference puVar6;
  Vector *DTB;
  EulerAngles *DTB_00;
  ClockTime *DTB_01;
  MineFusing *DTB_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  KException *this_00;
  reference puVar8;
  MinePaintScheme *DTB_03;
  size_type sVar9;
  pointer pMVar10;
  map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
  *pmVar11;
  pointer ppVar12;
  reference DTB_04;
  byte bVar13;
  KFLOAT32 KVar14;
  __normal_iterator<const_KDIS::DATA_TYPE::Vector_*,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>
  local_1d0;
  const_iterator citrVrEnd;
  const_iterator citrVr;
  const_iterator citrWrEnd_1;
  const_iterator citrWr_1;
  byte local_199;
  const_iterator cStack_198;
  KUINT8 i_2;
  const_iterator citrWrEnd;
  const_iterator citrWr;
  byte local_171;
  KUINT8 i_1;
  byte local_159;
  KUINT8 i;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_148;
  const_iterator citrSDCEnd;
  const_iterator citrSDC;
  allocator<char> local_121;
  KString local_120;
  Mine *local_100;
  Mine *local_f8;
  Mine *local_f0;
  Mine *local_e8;
  Mine *local_e0;
  Mine *local_d8;
  Mine *local_d0;
  Mine *local_c8;
  Mine *local_c0;
  Mine *local_b8;
  Mine *local_b0;
  Mine *local_a8;
  Mine *local_a0;
  Mine *local_98;
  Mine *local_90;
  Mine *local_88;
  Mine *local_80;
  Mine *local_78;
  Mine *local_70;
  Mine *local_68;
  Mine *local_60;
  Mine *local_58;
  __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
  local_50;
  const_iterator citrMnEnd;
  const_iterator citrMn;
  const_iterator cStack_38;
  KUINT16 ui16Pad;
  const_iterator citrStEnd;
  const_iterator citrSt;
  Header *pHead;
  KUINT8 ui8Pad;
  KUINT8 ui8PaddingNeeded4;
  KUINT8 ui8PaddingNeeded3;
  KUINT8 ui8PaddingNeeded2;
  KUINT8 ui8PaddingNeeded1;
  KUINT16 m_ui16OldLength;
  KDataStream *stream_local;
  Minefield_Data_PDU *this_local;
  
  PDUL = (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  bVar13 = (byte)((uint)this->m_ui8NumSensTyp % 2 << 1);
  bVar1 = calcPaddingPaintScheme(this);
  pHead._3_1_ = 0;
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsTripDetonationWire(&this->m_DataFilter);
  if (KVar2) {
    pHead._3_1_ = (byte)((int)(4 - (uint)this->m_ui8NumMines) % 4);
  }
  bVar3 = calcPaddingVertices(this);
  Header6::SetPDULength
            ((Header6 *)this,
             (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength +
             (ushort)bVar13 + (ushort)bVar1 + (ushort)pHead._3_1_ + (ushort)bVar3);
  Minefield_Header::Encode(&this->super_Minefield_Header,stream);
  pKVar5 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_ReqID);
  pKVar5 = KDataStream::operator<<(pKVar5,(this->m_SeqNumUnion).m_ui16SeqNum);
  pKVar5 = KDataStream::operator<<(pKVar5,this->m_ui8ReqID);
  pKVar5 = KDataStream::operator<<(pKVar5,this->m_ui8PduSeqNum);
  pKVar5 = KDataStream::operator<<(pKVar5,this->m_ui8NumPdus);
  pKVar5 = KDataStream::operator<<(pKVar5,this->m_ui8NumMines);
  pKVar5 = KDataStream::operator<<(pKVar5,this->m_ui8NumSensTyp);
  pKVar5 = KDataStream::operator<<(pKVar5,this->m_ui8Padding1);
  pKVar5 = DATA_TYPE::operator<<(pKVar5,&(this->m_DataFilter).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar5,&(this->m_MineTyp).super_DataTypeBase);
  citrStEnd = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                        (&this->m_vui16SensorTypes);
  cStack_38 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                        (&this->m_vui16SensorTypes);
  while (bVar4 = __gnu_cxx::operator!=(&citrStEnd,&stack0xffffffffffffffc8), bVar4) {
    puVar6 = __gnu_cxx::
             __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&citrStEnd);
    KDataStream::operator<<(stream,*puVar6);
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&citrStEnd);
  }
  if (bVar13 != 0) {
    KDataStream::operator<<(stream,0);
  }
  __gnu_cxx::
  __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
  ::__normal_iterator(&citrMnEnd);
  __gnu_cxx::
  __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
  ::__normal_iterator(&local_50);
  local_58 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                     begin(&this->m_vMines);
  citrMnEnd._M_current = local_58;
  local_60 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                               (&this->m_vMines);
  local_50._M_current = local_60;
  while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    DTB = DATA_TYPE::Mine::GetLocation(pMVar10);
    DATA_TYPE::operator<<(stream,&DTB->super_DataTypeBase);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsGroundBurialDepthOffset(&this->m_DataFilter);
  if (KVar2) {
    local_68 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                       begin(&this->m_vMines);
    citrMnEnd = (const_iterator)local_68;
  }
  local_70 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                               (&this->m_vMines);
  local_50._M_current = local_70;
  while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    KVar14 = DATA_TYPE::Mine::GetGroundBurialDepthOffsetValue(pMVar10);
    KDataStream::operator<<(stream,(float)KVar14);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsWaterBurialDepthOffset(&this->m_DataFilter);
  if (KVar2) {
    local_78 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                       begin(&this->m_vMines);
    citrMnEnd = (const_iterator)local_78;
  }
  local_80 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                               (&this->m_vMines);
  local_50._M_current = local_80;
  while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    KVar14 = DATA_TYPE::Mine::GetWaterBurialDepthOffsetValue(pMVar10);
    KDataStream::operator<<(stream,(float)KVar14);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsSnowBurialDepthOffset(&this->m_DataFilter);
  if (KVar2) {
    local_88 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                       begin(&this->m_vMines);
    citrMnEnd = (const_iterator)local_88;
  }
  local_90 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                               (&this->m_vMines);
  local_50._M_current = local_90;
  while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    KVar14 = DATA_TYPE::Mine::GetSnowBurialDepthOffsetValue(pMVar10);
    KDataStream::operator<<(stream,(float)KVar14);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsMineOrientation(&this->m_DataFilter);
  if (KVar2) {
    local_98 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                       begin(&this->m_vMines);
    citrMnEnd = (const_iterator)local_98;
  }
  local_a0 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                               (&this->m_vMines);
  local_50._M_current = local_a0;
  while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    DTB_00 = DATA_TYPE::Mine::GetMineOrientationValue(pMVar10);
    DATA_TYPE::operator<<(stream,&DTB_00->super_DataTypeBase);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsThermalContrast(&this->m_DataFilter);
  if (KVar2) {
    local_a8 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                       begin(&this->m_vMines);
    citrMnEnd = (const_iterator)local_a8;
  }
  local_b0 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                               (&this->m_vMines);
  local_50._M_current = local_b0;
  while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    KVar14 = DATA_TYPE::Mine::GetThermalContrastValue(pMVar10);
    KDataStream::operator<<(stream,(float)KVar14);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsReflectance(&this->m_DataFilter);
  if (KVar2) {
    local_b8 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                       begin(&this->m_vMines);
    citrMnEnd = (const_iterator)local_b8;
  }
  local_c0 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                               (&this->m_vMines);
  local_50._M_current = local_c0;
  while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    KVar14 = DATA_TYPE::Mine::GetReflectanceValue(pMVar10);
    KDataStream::operator<<(stream,(float)KVar14);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsMineEmplacementAge(&this->m_DataFilter);
  if (KVar2) {
    local_c8 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                       begin(&this->m_vMines);
    citrMnEnd = (const_iterator)local_c8;
  }
  local_d0 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                               (&this->m_vMines);
  local_50._M_current = local_d0;
  while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    DTB_01 = DATA_TYPE::Mine::GetMineEmplacementAgeValue(pMVar10);
    DATA_TYPE::operator<<(stream,&DTB_01->super_DataTypeBase);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  local_d8 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                     begin(&this->m_vMines);
  citrMnEnd._M_current = local_d8;
  local_e0 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                               (&this->m_vMines);
  local_50._M_current = local_e0;
  while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    T_00 = DATA_TYPE::Mine::GetID(pMVar10);
    KDataStream::operator<<(stream,T_00);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsFusing(&this->m_DataFilter);
  if (KVar2) {
    local_e8 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                       begin(&this->m_vMines);
    citrMnEnd = (const_iterator)local_e8;
  }
  local_f0 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                               (&this->m_vMines);
  local_50._M_current = local_f0;
  while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    DTB_02 = DATA_TYPE::Mine::GetFusingValue(pMVar10);
    DATA_TYPE::operator<<(stream,&DTB_02->super_DataTypeBase);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsScalarDetectionCoefficient(&this->m_DataFilter);
  if (KVar2) {
    local_f8 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                       end(&this->m_vMines);
    local_50._M_current = local_f8;
    local_100 = (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                        begin(&this->m_vMines);
    citrMnEnd = (const_iterator)local_100;
    while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
      bVar13 = this->m_ui8NumSensTyp;
      pMVar10 = __gnu_cxx::
                __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
                ::operator->(&citrMnEnd);
      pvVar7 = DATA_TYPE::Mine::GetScalarDetectionCoefficientValues(pMVar10);
      sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar7);
      if (bVar13 != sVar9) {
        this_00 = (KException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Encode",&local_121)
        ;
        KException::KException<char_const*>
                  (this_00,&local_120,8,
                   "Mine does not have the correct number of scalar detection                                                               coefficient values. Each mine must have the same number of                                                               SDC values as sensor types"
                  );
        __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
      }
      pMVar10 = __gnu_cxx::
                __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
                ::operator->(&citrMnEnd);
      pvVar7 = DATA_TYPE::Mine::GetScalarDetectionCoefficientValues(pMVar10);
      citrSDCEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar7);
      pMVar10 = __gnu_cxx::
                __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
                ::operator->(&citrMnEnd);
      pvVar7 = DATA_TYPE::Mine::GetScalarDetectionCoefficientValues(pMVar10);
      local_148._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar7);
      while (bVar4 = __gnu_cxx::operator!=(&citrSDCEnd,&local_148), bVar4) {
        puVar8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&citrSDCEnd);
        KDataStream::operator<<(stream,*puVar8);
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&citrSDCEnd);
      }
      __gnu_cxx::
      __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
      ::operator++(&citrMnEnd);
    }
  }
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsPaintScheme(&this->m_DataFilter);
  if (KVar2) {
    citrMnEnd = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::begin
                          (&this->m_vMines);
  }
  local_50._M_current =
       (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                         (&this->m_vMines);
  while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    DTB_03 = DATA_TYPE::Mine::GetPaintSchemeValue(pMVar10);
    DATA_TYPE::operator<<(stream,&DTB_03->super_DataTypeBase);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  for (local_159 = 0; local_159 < bVar1; local_159 = local_159 + 1) {
    KDataStream::operator<<(stream,'\0');
  }
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsTripDetonationWire(&this->m_DataFilter);
  if (KVar2) {
    citrMnEnd = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::begin
                          (&this->m_vMines);
    local_50._M_current =
         (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                           (&this->m_vMines);
    while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
      pMVar10 = __gnu_cxx::
                __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
                ::operator->(&citrMnEnd);
      T = DATA_TYPE::Mine::GetNumberTripDetonationWires(pMVar10);
      KDataStream::operator<<(stream,T);
      __gnu_cxx::
      __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
      ::operator++(&citrMnEnd);
    }
    for (local_171 = 0; local_171 < pHead._3_1_; local_171 = local_171 + 1) {
      KDataStream::operator<<(stream,'\0');
    }
    local_50._M_current =
         (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                           (&this->m_vMines);
    citrMnEnd = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::begin
                          (&this->m_vMines);
    while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
      pMVar10 = __gnu_cxx::
                __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
                ::operator->(&citrMnEnd);
      pmVar11 = DATA_TYPE::Mine::GetTripDetonationWire(pMVar10);
      citrWrEnd = std::
                  map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
                  ::begin(pmVar11);
      pMVar10 = __gnu_cxx::
                __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
                ::operator->(&citrMnEnd);
      pmVar11 = DATA_TYPE::Mine::GetTripDetonationWire(pMVar10);
      cStack_198 = std::
                   map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
                   ::end(pmVar11);
      while (bVar4 = std::operator!=(&citrWrEnd,&stack0xfffffffffffffe68), bVar4) {
        ppVar12 = std::
                  _Rb_tree_const_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
                  ::operator->(&citrWrEnd);
        sVar9 = std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::size
                          (&ppVar12->second);
        KDataStream::operator<<(stream,(uchar)sVar9);
        std::
        _Rb_tree_const_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
        ::operator++(&citrWrEnd);
      }
      __gnu_cxx::
      __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
      ::operator++(&citrMnEnd);
    }
  }
  for (local_199 = 0; local_199 < bVar3; local_199 = local_199 + 1) {
    KDataStream::operator<<(stream,'\0');
  }
  local_50._M_current =
       (Mine *)std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::end
                         (&this->m_vMines);
  citrMnEnd = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::begin
                        (&this->m_vMines);
  while (bVar4 = __gnu_cxx::operator!=(&citrMnEnd,&local_50), bVar4) {
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    pmVar11 = DATA_TYPE::Mine::GetTripDetonationWire(pMVar10);
    citrWrEnd_1 = std::
                  map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
                  ::begin(pmVar11);
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
              ::operator->(&citrMnEnd);
    pmVar11 = DATA_TYPE::Mine::GetTripDetonationWire(pMVar10);
    citrVr._M_current =
         (Vector *)
         std::
         map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
         ::end(pmVar11);
    while (bVar4 = std::operator!=(&citrWrEnd_1,(_Self *)&citrVr), bVar4) {
      ppVar12 = std::
                _Rb_tree_const_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
                ::operator->(&citrWrEnd_1);
      citrVrEnd = std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::
                  begin(&ppVar12->second);
      ppVar12 = std::
                _Rb_tree_const_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
                ::operator->(&citrWrEnd_1);
      local_1d0._M_current =
           (Vector *)
           std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::end
                     (&ppVar12->second);
      while (bVar4 = __gnu_cxx::operator!=(&citrVrEnd,&local_1d0), bVar4) {
        DTB_04 = __gnu_cxx::
                 __normal_iterator<const_KDIS::DATA_TYPE::Vector_*,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>
                 ::operator*(&citrVrEnd);
        DATA_TYPE::operator<<(stream,&DTB_04->super_DataTypeBase);
        __gnu_cxx::
        __normal_iterator<const_KDIS::DATA_TYPE::Vector_*,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>
        ::operator++(&citrVrEnd);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
      ::operator++(&citrWrEnd_1);
    }
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Mine_*,_std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>_>
    ::operator++(&citrMnEnd);
  }
  Header6::SetPDULength((Header6 *)this,PDUL);
  return;
}

Assistant:

void Minefield_Data_PDU::Encode(KDataStream &stream) const noexcept(false)
{
    // Calculate padding first and add it to the pdu length
    KUINT16 m_ui16OldLength = m_ui16PDULength;
    KUINT8 ui8PaddingNeeded1 = ( m_ui8NumSensTyp % 2 ) * 2;
    KUINT8 ui8PaddingNeeded2 = calcPaddingPaintScheme();
    KUINT8 ui8PaddingNeeded3 = 0;
    if( m_DataFilter.IsTripDetonationWire() )ui8PaddingNeeded3 += ( 4 - m_ui8NumMines ) % 4;
    KUINT8 ui8PaddingNeeded4 = calcPaddingVertices();
    KUINT8 ui8Pad = 0;

    // Add all the padding to the PDU length
    Header * pHead = ( Header* )this;
    pHead->SetPDULength( m_ui16PDULength + ui8PaddingNeeded1 + ui8PaddingNeeded2 + ui8PaddingNeeded3 + ui8PaddingNeeded4 );

    Minefield_Header::Encode( stream );

    stream << KDIS_STREAM m_ReqID
           << m_SeqNumUnion.m_ui16SeqNum
           << m_ui8ReqID
           << m_ui8PduSeqNum
           << m_ui8NumPdus
           << m_ui8NumMines
           << m_ui8NumSensTyp
           << m_ui8Padding1
           << KDIS_STREAM m_DataFilter
           << KDIS_STREAM m_MineTyp;

    // Sensor Types
    vector<KUINT16>::const_iterator citrSt = m_vui16SensorTypes.begin();
    vector<KUINT16>::const_iterator citrStEnd = m_vui16SensorTypes.end();
    for( ; citrSt != citrStEnd; ++citrSt )
    {
        stream << *citrSt;
    }

    if( ui8PaddingNeeded1 )
    {
        KUINT16 ui16Pad = 0;
        stream << ui16Pad;
    }

    /************************************************************************/
    /* Mines                                                                */
    /************************************************************************/
    vector<Mine>::const_iterator citrMn;
    vector<Mine>::const_iterator citrMnEnd;

    MINE_ENCODE_CLASS( GetLocation )

    // The following are all dependent on the data filter( except ID ):
    if( m_DataFilter.IsGroundBurialDepthOffset() )  MINE_ENCODE_NATIVE( GetGroundBurialDepthOffsetValue )
        if( m_DataFilter.IsWaterBurialDepthOffset() )   MINE_ENCODE_NATIVE( GetWaterBurialDepthOffsetValue )
            if( m_DataFilter.IsSnowBurialDepthOffset() )    MINE_ENCODE_NATIVE( GetSnowBurialDepthOffsetValue )
                if( m_DataFilter.IsMineOrientation() )          MINE_ENCODE_CLASS( GetMineOrientationValue )
                    if( m_DataFilter.IsThermalContrast() )          MINE_ENCODE_NATIVE( GetThermalContrastValue )
                        if( m_DataFilter.IsReflectance() )              MINE_ENCODE_NATIVE( GetReflectanceValue )
                            if( m_DataFilter.IsMineEmplacementAge() )       MINE_ENCODE_CLASS( GetMineEmplacementAgeValue )
                                MINE_ENCODE_NATIVE( GetID )
                                if( m_DataFilter.IsFusing() )                   MINE_ENCODE_CLASS( GetFusingValue )

                                    if( m_DataFilter.IsScalarDetectionCoefficient() )
                                    {
                                        citrMnEnd = m_vMines.end();
                                        citrMn = m_vMines.begin();
                                        for( ; citrMn != citrMnEnd; ++citrMn )
                                        {
                                            // First check that the mine has the correct number of SDC.
                                            if( m_ui8NumSensTyp != citrMn->GetScalarDetectionCoefficientValues().size() )
                                            {
                                                throw KException( __FUNCTION__, INVALID_DATA, "Mine does not have the correct number of scalar detection \
                                                              coefficient values. Each mine must have the same number of \
                                                              SDC values as sensor types" );
                                            }

                                            vector<KUINT8>::const_iterator citrSDC = citrMn->GetScalarDetectionCoefficientValues().begin();
                                            vector<KUINT8>::const_iterator citrSDCEnd = citrMn->GetScalarDetectionCoefficientValues().end();
                                            for( ; citrSDC != citrSDCEnd; ++citrSDC )
                                            {
                                                stream << *citrSDC;
                                            }
                                        }
                                    }

    if( m_DataFilter.IsPaintScheme() ) MINE_ENCODE_CLASS( GetPaintSchemeValue )

        // Do we need to add padding?
        for( KUINT8 i = 0; i < ui8PaddingNeeded2; ++i )
        {
            stream << ui8Pad;
        }

    // Trip/Det wires
    if( m_DataFilter.IsTripDetonationWire() )
    {
        MINE_ENCODE_NATIVE( GetNumberTripDetonationWires )

        // Do we need more padding? [(4-n) mod4] 8[F(7)]
        for( KUINT8 i = 0; i < ui8PaddingNeeded3; ++i )
        {
            stream << ui8Pad;
        }

        // Number of vertices's field
        citrMnEnd = m_vMines.end();
        citrMn = m_vMines.begin();
        for( ; citrMn != citrMnEnd; ++citrMn )
        {
            map< KUINT16, vector<Vector> >::const_iterator citrWr = citrMn->GetTripDetonationWire().begin();
            map< KUINT16, vector<Vector> >::const_iterator citrWrEnd = citrMn->GetTripDetonationWire().end();
            for( ; citrWr != citrWrEnd; ++citrWr )
            {
                stream << ( KUINT8 )citrWr->second.size();
            }
        }
    }

    // Padding?
    for( KUINT8 i = 0; i < ui8PaddingNeeded4; ++i )
    {
        stream << ui8Pad;
    }

    // Vertices's
    citrMnEnd = m_vMines.end();
    citrMn = m_vMines.begin();
    for( ; citrMn != citrMnEnd; ++citrMn )
    {
        map< KUINT16, vector<Vector> >::const_iterator citrWr = citrMn->GetTripDetonationWire().begin();
        map< KUINT16, vector<Vector> >::const_iterator citrWrEnd = citrMn->GetTripDetonationWire().end();
        for( ; citrWr != citrWrEnd; ++citrWr )
        {
            vector<Vector>::const_iterator citrVr = citrWr->second.begin();
            vector<Vector>::const_iterator citrVrEnd = citrWr->second.end();
            for( ; citrVr != citrVrEnd; ++citrVr )
            {
                stream << KDIS_STREAM *citrVr;
            }
        }
    }

    // Reset the length for the next encode
    pHead->SetPDULength( m_ui16OldLength );
}